

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *pIVar1;
  int iVar2;
  ImDrawChannel *pIVar3;
  ImWchar *__src;
  ImDrawChannel *pIVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  wchar_t wVar10;
  ulong uVar11;
  ImDrawCmd *pIVar12;
  long lVar13;
  ImDrawCmd *pIVar14;
  long lVar15;
  uint *puVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  wchar_t wVar20;
  long lVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ImWchar *local_40;
  
  if (this->_Count < 2) {
    return;
  }
  iVar18 = 0;
  SetCurrentChannel(this,draw_list,0);
  ImDrawList::_PopUnusedDrawCmd(draw_list);
  iVar17 = 0;
  if (0 < this->_Count) {
    lVar15 = (long)(draw_list->CmdBuffer).Size;
    iVar18 = 0;
    if (lVar15 < 1) {
LAB_001c7390:
      pIVar12 = (ImDrawCmd *)0x0;
      uVar22 = 0;
    }
    else {
      pIVar14 = (draw_list->CmdBuffer).Data;
      pIVar12 = pIVar14 + lVar15 + -1;
      if (pIVar12 == (ImDrawCmd *)0x0) goto LAB_001c7390;
      uVar22 = pIVar14[lVar15 + -1].ElemCount + pIVar14[lVar15 + -1].IdxOffset;
    }
    if (this->_Count != 1) {
      iVar17 = 0;
      lVar15 = 1;
      iVar18 = 0;
      do {
        if ((this->_Channels).Size <= lVar15) goto LAB_001c7710;
        pIVar3 = (this->_Channels).Data;
        pIVar4 = pIVar3 + lVar15;
        wVar10 = pIVar3[lVar15]._CmdBuffer.Size;
        uVar11 = (ulong)wVar10;
        if ((long)uVar11 < 1) {
LAB_001c748d:
          wVar20 = (pIVar4->_IdxBuffer).Size;
        }
        else {
          if ((pIVar4->_CmdBuffer).Data[uVar11 - 1].ElemCount == 0) {
            uVar11 = (ulong)(uint)(wVar10 + L'\xffffffff');
            (pIVar4->_CmdBuffer).Size = wVar10 + L'\xffffffff';
          }
          if (((int)uVar11 == 0) || (pIVar12 == (ImDrawCmd *)0x0)) {
LAB_001c745d:
            wVar10 = (wchar_t)uVar11;
            if (wVar10 < L'\x01') goto LAB_001c748d;
          }
          else {
            pIVar14 = (pIVar4->_CmdBuffer).Data;
            auVar25[0] = -(*(char *)&(pIVar14->ClipRect).x == *(char *)&(pIVar12->ClipRect).x);
            auVar25[1] = -(*(char *)((long)&(pIVar14->ClipRect).x + 1) ==
                          *(char *)((long)&(pIVar12->ClipRect).x + 1));
            auVar25[2] = -(*(char *)((long)&(pIVar14->ClipRect).x + 2) ==
                          *(char *)((long)&(pIVar12->ClipRect).x + 2));
            auVar25[3] = -(*(char *)((long)&(pIVar14->ClipRect).x + 3) ==
                          *(char *)((long)&(pIVar12->ClipRect).x + 3));
            auVar25[4] = -(*(char *)&(pIVar14->ClipRect).y == *(char *)&(pIVar12->ClipRect).y);
            auVar25[5] = -(*(char *)((long)&(pIVar14->ClipRect).y + 1) ==
                          *(char *)((long)&(pIVar12->ClipRect).y + 1));
            auVar25[6] = -(*(char *)((long)&(pIVar14->ClipRect).y + 2) ==
                          *(char *)((long)&(pIVar12->ClipRect).y + 2));
            auVar25[7] = -(*(char *)((long)&(pIVar14->ClipRect).y + 3) ==
                          *(char *)((long)&(pIVar12->ClipRect).y + 3));
            auVar25[8] = -(*(char *)&(pIVar14->ClipRect).z == *(char *)&(pIVar12->ClipRect).z);
            auVar25[9] = -(*(char *)((long)&(pIVar14->ClipRect).z + 1) ==
                          *(char *)((long)&(pIVar12->ClipRect).z + 1));
            auVar25[10] = -(*(char *)((long)&(pIVar14->ClipRect).z + 2) ==
                           *(char *)((long)&(pIVar12->ClipRect).z + 2));
            auVar25[0xb] = -(*(char *)((long)&(pIVar14->ClipRect).z + 3) ==
                            *(char *)((long)&(pIVar12->ClipRect).z + 3));
            auVar25[0xc] = -(*(char *)&(pIVar14->ClipRect).w == *(char *)&(pIVar12->ClipRect).w);
            auVar25[0xd] = -(*(char *)((long)&(pIVar14->ClipRect).w + 1) ==
                            *(char *)((long)&(pIVar12->ClipRect).w + 1));
            auVar25[0xe] = -(*(char *)((long)&(pIVar14->ClipRect).w + 2) ==
                            *(char *)((long)&(pIVar12->ClipRect).w + 2));
            auVar25[0xf] = -(*(char *)((long)&(pIVar14->ClipRect).w + 3) ==
                            *(char *)((long)&(pIVar12->ClipRect).w + 3));
            auVar23[0] = -(*(char *)&(pIVar14->ClipRect).w == *(char *)&(pIVar12->ClipRect).w);
            auVar23[1] = -(*(char *)((long)&(pIVar14->ClipRect).w + 1) ==
                          *(char *)((long)&(pIVar12->ClipRect).w + 1));
            auVar23[2] = -(*(char *)((long)&(pIVar14->ClipRect).w + 2) ==
                          *(char *)((long)&(pIVar12->ClipRect).w + 2));
            auVar23[3] = -(*(char *)((long)&(pIVar14->ClipRect).w + 3) ==
                          *(char *)((long)&(pIVar12->ClipRect).w + 3));
            auVar23[4] = -(*(char *)&pIVar14->TextureId == *(char *)&pIVar12->TextureId);
            auVar23[5] = -(*(char *)((long)&pIVar14->TextureId + 1) ==
                          *(char *)((long)&pIVar12->TextureId + 1));
            auVar23[6] = -(*(char *)((long)&pIVar14->TextureId + 2) ==
                          *(char *)((long)&pIVar12->TextureId + 2));
            auVar23[7] = -(*(char *)((long)&pIVar14->TextureId + 3) ==
                          *(char *)((long)&pIVar12->TextureId + 3));
            auVar23[8] = -(*(char *)((long)&pIVar14->TextureId + 4) ==
                          *(char *)((long)&pIVar12->TextureId + 4));
            auVar23[9] = -(*(char *)((long)&pIVar14->TextureId + 5) ==
                          *(char *)((long)&pIVar12->TextureId + 5));
            auVar23[10] = -(*(char *)((long)&pIVar14->TextureId + 6) ==
                           *(char *)((long)&pIVar12->TextureId + 6));
            auVar23[0xb] = -(*(char *)((long)&pIVar14->TextureId + 7) ==
                            *(char *)((long)&pIVar12->TextureId + 7));
            auVar23[0xc] = -((char)pIVar14->VtxOffset == (char)pIVar12->VtxOffset);
            auVar23[0xd] = -(*(char *)((long)&pIVar14->VtxOffset + 1) ==
                            *(char *)((long)&pIVar12->VtxOffset + 1));
            auVar23[0xe] = -(*(char *)((long)&pIVar14->VtxOffset + 2) ==
                            *(char *)((long)&pIVar12->VtxOffset + 2));
            auVar23[0xf] = -(*(char *)((long)&pIVar14->VtxOffset + 3) ==
                            *(char *)((long)&pIVar12->VtxOffset + 3));
            auVar23 = auVar23 & auVar25;
            if (((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff) &&
               (pIVar14->UserCallback == (ImDrawCallback)0x0 &&
                pIVar12->UserCallback == (ImDrawCallback)0x0)) {
              pIVar12->ElemCount = pIVar12->ElemCount + pIVar14->ElemCount;
              uVar22 = uVar22 + pIVar14->ElemCount;
              memmove(pIVar14,pIVar14 + 1,(uVar11 & 0xffffffff) * 0x38 - 0x38);
              wVar10 = (pIVar4->_CmdBuffer).Size + L'\xffffffff';
              uVar11 = (ulong)(uint)wVar10;
              (pIVar4->_CmdBuffer).Size = wVar10;
              goto LAB_001c745d;
            }
          }
          pIVar14 = (pIVar4->_CmdBuffer).Data;
          wVar10 = (wchar_t)uVar11;
          uVar11 = uVar11 & 0xffffffff;
          pIVar12 = pIVar14 + (uVar11 - 1);
          wVar20 = (pIVar4->_IdxBuffer).Size;
          puVar16 = &pIVar14->ElemCount;
          do {
            puVar16[-1] = uVar22;
            uVar22 = uVar22 + *puVar16;
            puVar16 = puVar16 + 0xe;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        iVar18 = iVar18 + wVar20;
        iVar17 = iVar17 + wVar10;
        lVar15 = lVar15 + 1;
      } while (lVar15 < this->_Count);
    }
  }
  uVar22 = (draw_list->CmdBuffer).Size + iVar17;
  iVar2 = (draw_list->CmdBuffer).Capacity;
  if (iVar2 < (int)uVar22) {
    if (iVar2 == 0) {
      uVar19 = 8;
    }
    else {
      uVar19 = iVar2 / 2 + iVar2;
    }
    if ((int)uVar19 <= (int)uVar22) {
      uVar19 = uVar22;
    }
    pIVar12 = (ImDrawCmd *)ImGui::MemAlloc((long)(int)uVar19 * 0x38);
    pIVar14 = (draw_list->CmdBuffer).Data;
    if (pIVar14 != (ImDrawCmd *)0x0) {
      memcpy(pIVar12,pIVar14,(long)(draw_list->CmdBuffer).Size * 0x38);
      ImGui::MemFree((draw_list->CmdBuffer).Data);
    }
    (draw_list->CmdBuffer).Data = pIVar12;
    (draw_list->CmdBuffer).Capacity = uVar19;
  }
  (draw_list->CmdBuffer).Size = uVar22;
  lVar15 = (long)(draw_list->IdxBuffer).Size + (long)iVar18;
  wVar10 = (draw_list->IdxBuffer).Capacity;
  wVar20 = (wchar_t)lVar15;
  if (wVar10 < wVar20) {
    if (wVar10 == L'\0') {
      wVar10 = L'\b';
    }
    else {
      wVar10 = wVar10 / 2 + wVar10;
    }
    if (wVar10 <= wVar20) {
      wVar10 = wVar20;
    }
    local_40 = (ImWchar *)ImGui::MemAlloc((long)wVar10 * 2);
    __src = (draw_list->IdxBuffer).Data;
    if (__src != (ImWchar *)0x0) {
      memcpy(local_40,__src,(long)(draw_list->IdxBuffer).Size * 2);
      ImGui::MemFree((draw_list->IdxBuffer).Data);
    }
    (draw_list->IdxBuffer).Data = local_40;
    (draw_list->IdxBuffer).Capacity = wVar10;
    uVar22 = (draw_list->CmdBuffer).Size;
  }
  else {
    local_40 = (draw_list->IdxBuffer).Data;
  }
  (draw_list->IdxBuffer).Size = wVar20;
  local_40 = local_40 + (lVar15 - iVar18);
  if (1 < this->_Count) {
    pIVar14 = (draw_list->CmdBuffer).Data + ((long)(int)uVar22 - (long)iVar17);
    lVar21 = 1;
    lVar15 = 0x38;
    do {
      if ((this->_Channels).Size <= lVar21) {
LAB_001c7710:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
      }
      pIVar4 = (this->_Channels).Data;
      lVar13 = (long)*(int *)((long)pIVar4 + lVar15 + -0x18);
      if (lVar13 != 0) {
        memcpy(pIVar14,*(void **)((long)pIVar4 + lVar15 + -0x10),lVar13 * 0x38);
        pIVar14 = pIVar14 + lVar13;
      }
      lVar13 = (long)*(int *)((long)pIVar4 + lVar15 + -8);
      if (lVar13 != 0) {
        memcpy(local_40,*(void **)((long)&(pIVar4->_CmdBuffer).Size + lVar15),lVar13 * 2);
        local_40 = local_40 + lVar13;
      }
      lVar21 = lVar21 + 1;
      lVar15 = lVar15 + 0x20;
    } while (lVar21 < this->_Count);
    uVar22 = (draw_list->CmdBuffer).Size;
  }
  draw_list->_IdxWritePtr = local_40;
  if (uVar22 != 0) {
    if ((int)uVar22 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x70f,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar14 = (draw_list->CmdBuffer).Data;
    if (pIVar14[(ulong)uVar22 - 1].UserCallback == (ImDrawCallback)0x0) goto LAB_001c769a;
  }
  ImDrawList::AddDrawCmd(draw_list);
  pIVar14 = (draw_list->CmdBuffer).Data;
  uVar22 = (draw_list->CmdBuffer).Size;
LAB_001c769a:
  pIVar12 = pIVar14 + (long)(int)uVar22 + -1;
  pIVar1 = &draw_list->_CmdHeader;
  if (pIVar14[(long)(int)uVar22 + -1].ElemCount == 0) {
    fVar6 = (pIVar1->ClipRect).x;
    fVar7 = (pIVar1->ClipRect).y;
    fVar8 = (draw_list->_CmdHeader).ClipRect.z;
    fVar9 = (draw_list->_CmdHeader).ClipRect.w;
    uVar5 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
    *(undefined8 *)&pIVar14[(long)(int)uVar22 + -1].ClipRect.w =
         *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
    *(undefined8 *)((long)&pIVar14[(long)(int)uVar22 + -1].TextureId + 4) = uVar5;
    (pIVar12->ClipRect).x = fVar6;
    (pIVar12->ClipRect).y = fVar7;
    pIVar14[(long)(int)uVar22 + -1].ClipRect.z = fVar8;
    pIVar14[(long)(int)uVar22 + -1].ClipRect.w = fVar9;
  }
  else {
    auVar26[0] = -(*(char *)&(pIVar1->ClipRect).x == *(char *)&(pIVar12->ClipRect).x);
    auVar26[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.x + 1));
    auVar26[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.x + 2));
    auVar26[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.x + 3));
    auVar26[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                  *(char *)&pIVar14[(long)(int)uVar22 + -1].ClipRect.y);
    auVar26[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.y + 1));
    auVar26[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.y + 2));
    auVar26[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.y + 3));
    auVar26[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                  *(char *)&pIVar14[(long)(int)uVar22 + -1].ClipRect.z);
    auVar26[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.z + 1));
    auVar26[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                   *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.z + 2));
    auVar26[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                    *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.z + 3));
    auVar26[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar14[(long)(int)uVar22 + -1].ClipRect.w);
    auVar26[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.w + 1));
    auVar26[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.w + 2));
    auVar26[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.w + 3));
    auVar24[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                  *(char *)&pIVar14[(long)(int)uVar22 + -1].ClipRect.w);
    auVar24[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.w + 1));
    auVar24[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.w + 2));
    auVar24[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].ClipRect.w + 3));
    auVar24[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                  *(char *)&pIVar14[(long)(int)uVar22 + -1].TextureId);
    auVar24[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].TextureId + 1));
    auVar24[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].TextureId + 2));
    auVar24[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].TextureId + 3));
    auVar24[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].TextureId + 4));
    auVar24[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                  *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].TextureId + 5));
    auVar24[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                   *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].TextureId + 6));
    auVar24[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                    *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].TextureId + 7));
    auVar24[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset ==
                    (char)pIVar14[(long)(int)uVar22 + -1].VtxOffset);
    auVar24[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                    *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].VtxOffset + 1));
    auVar24[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                    *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].VtxOffset + 2));
    auVar24[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                    *(char *)((long)&pIVar14[(long)(int)uVar22 + -1].VtxOffset + 3));
    auVar24 = auVar24 & auVar26;
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff) {
      ImDrawList::AddDrawCmd(draw_list);
    }
  }
  this->_Count = 1;
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}